

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

String * __thiscall
kj::anon_unknown_0::tryParse
          (String *__return_storage_ptr__,anon_unknown_0 *this,WaitScope *waitScope,Network *network
          ,StringPtr text,uint portHint)

{
  NetworkAddress *pNVar1;
  Promise<kj::Own<kj::NetworkAddress>_> local_58;
  Own<kj::NetworkAddress> local_48;
  undefined4 local_34;
  WaitScope *pWStack_30;
  uint portHint_local;
  Network *network_local;
  WaitScope *waitScope_local;
  StringPtr text_local;
  
  text_local.content.ptr = text.content.ptr;
  local_34 = (undefined4)text.content.size_;
  pWStack_30 = waitScope;
  network_local = (Network *)this;
  waitScope_local = (WaitScope *)network;
  text_local.content.size_ = (size_t)__return_storage_ptr__;
  (*(code *)waitScope->loop->port)(&local_58,waitScope,network,text_local.content.ptr,local_34);
  Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&local_48,&local_58);
  pNVar1 = Own<kj::NetworkAddress>::operator->(&local_48);
  (*pNVar1->_vptr_NetworkAddress[4])(__return_storage_ptr__);
  Own<kj::NetworkAddress>::~Own(&local_48);
  Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String tryParse(WaitScope& waitScope, Network& network, StringPtr text, uint portHint = 0) {
  return network.parseAddress(text, portHint).wait(waitScope)->toString();
}